

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

float resampler_get_sample_float(void *_r)

{
  float fVar1;
  
  if ((*(int *)((long)_r + 0xc) < 1) && (*(long *)((long)_r + 0x18) != 0)) {
    resampler_fill_and_remove_delay((resampler *)_r);
  }
  if (*(int *)((long)_r + 0xc) < 1) {
    fVar1 = 0.0;
  }
  else if ((*(byte *)((long)_r + 0x30) | 2) == 3) {
    fVar1 = (float)((double)*(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) +
                   *(double *)((long)_r + 0x40));
  }
  else {
    fVar1 = *(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248);
  }
  return fVar1;
}

Assistant:

float resampler_get_sample_float(void *_r)
{
    resampler * r = ( resampler * ) _r;
    if ( r->read_filled < 1 && r->phase_inc.quad)
        resampler_fill_and_remove_delay( r );
    if ( r->read_filled < 1 )
        return 0;
    if ( r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM )
        return (float)(r->buffer_out[ r->read_pos ] + r->accumulator);
    else
        return r->buffer_out[ r->read_pos ];
}